

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

int __thiscall QFontEngine::glyphCount(QFontEngine *this)

{
  char *pcVar1;
  uint uVar2;
  long in_FS_OFFSET;
  Tag local_3c;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFont::Tag::Tag<5ul>(&local_3c,(char (*) [5])"maxp");
  getSfntTable((QByteArray *)&local_38,this,local_3c.m_value);
  uVar2 = 0;
  if ((undefined1 *)0x5 < (ulong)local_38.size) {
    pcVar1 = local_38.ptr;
    if (local_38.ptr == (char *)0x0) {
      pcVar1 = (char *)&QByteArray::_empty;
    }
    uVar2 = (uint)(ushort)(*(ushort *)(pcVar1 + 4) << 8 | *(ushort *)(pcVar1 + 4) >> 8);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFontEngine::glyphCount() const
{
    QByteArray maxpTable = getSfntTable(QFont::Tag("maxp").value());
    if (maxpTable.size() < 6)
        return 0;

    const uchar *source = reinterpret_cast<const uchar *>(maxpTable.constData() + 4);
    const uchar *end = source + maxpTable.size();

    quint16 count = 0;
    qSafeFromBigEndian(source, end, &count);
    return count;
}